

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

void __thiscall FIX::FieldMap::~FieldMap(FieldMap *this)

{
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f8a68;
  clear(this);
  shared_array<int>::release(&(this->m_order).m_groupOrder);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::~_Rb_tree(&(this->m_groups)._M_t);
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::~vector(&this->m_fields);
  return;
}

Assistant:

FieldMap::~FieldMap() { clear(); }